

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<10>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  int iVar1;
  RepeatedPtrFieldBase *x;
  MessageLite *msg;
  int local_2c;
  int i;
  RepeatedPtrFieldBase *array;
  ArrayOutput *output_local;
  FieldMetadata *md_local;
  void *field_local;
  
  x = Get<google::protobuf::internal::RepeatedPtrFieldBase>(field);
  local_2c = 0;
  while( true ) {
    iVar1 = AccessorHelper::Size(x);
    if (iVar1 <= local_2c) break;
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    msg = (MessageLite *)AccessorHelper::Get(x,local_2c);
    SerializeGroupTo<google::protobuf::internal::ArrayOutput>(msg,md->ptr,output);
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag + 1,output);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeGroupTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          static_cast<const SerializationTable*>(md.ptr), output);
      WriteTagTo(md.tag + 1, output);
    }
  }